

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O2

boolean output_pass_setup(j_decompress_ptr cinfo)

{
  uint uVar1;
  jpeg_progress_mgr *pjVar2;
  uint uVar3;
  uint uVar4;
  
  if (cinfo->global_state != 0xcc) {
    (*cinfo->master->prepare_for_output_pass)(cinfo);
    cinfo->output_scanline = 0;
    cinfo->global_state = 0xcc;
  }
  do {
    if (cinfo->master->is_dummy_pass == 0) {
      cinfo->global_state = 0xce - (uint)(cinfo->raw_data_out == 0);
      return 1;
    }
    uVar3 = cinfo->output_scanline;
    while (uVar1 = cinfo->output_height, uVar3 < uVar1) {
      pjVar2 = cinfo->progress;
      uVar4 = uVar3;
      if (pjVar2 != (jpeg_progress_mgr *)0x0) {
        pjVar2->pass_counter = (ulong)uVar3;
        pjVar2->pass_limit = (ulong)uVar1;
        (*pjVar2->progress_monitor)((j_common_ptr)cinfo);
        uVar4 = cinfo->output_scanline;
      }
      (*cinfo->main->process_data)(cinfo,(JSAMPARRAY)0x0,&cinfo->output_scanline,0);
      uVar3 = cinfo->output_scanline;
      if (uVar3 == uVar4) {
        return 0;
      }
    }
    (*cinfo->master->finish_output_pass)(cinfo);
    (*cinfo->master->prepare_for_output_pass)(cinfo);
    cinfo->output_scanline = 0;
  } while( true );
}

Assistant:

LOCAL(boolean)
output_pass_setup (j_decompress_ptr cinfo)
{
  if (cinfo->global_state != DSTATE_PRESCAN) {
    /* First call: do pass setup */
    (*cinfo->master->prepare_for_output_pass) (cinfo);
    cinfo->output_scanline = 0;
    cinfo->global_state = DSTATE_PRESCAN;
  }
  /* Loop over any required dummy passes */
  while (cinfo->master->is_dummy_pass) {
#ifdef QUANT_2PASS_SUPPORTED
    /* Crank through the dummy pass */
    while (cinfo->output_scanline < cinfo->output_height) {
      JDIMENSION last_scanline;
      /* Call progress monitor hook if present */
      if (cinfo->progress != NULL) {
	cinfo->progress->pass_counter = (long) cinfo->output_scanline;
	cinfo->progress->pass_limit = (long) cinfo->output_height;
	(*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
      }
      /* Process some data */
      last_scanline = cinfo->output_scanline;
      (*cinfo->main->process_data) (cinfo, (JSAMPARRAY) NULL,
				    &cinfo->output_scanline, (JDIMENSION) 0);
      if (cinfo->output_scanline == last_scanline)
	return FALSE;		/* No progress made, must suspend */
    }
    /* Finish up dummy pass, and set up for another one */
    (*cinfo->master->finish_output_pass) (cinfo);
    (*cinfo->master->prepare_for_output_pass) (cinfo);
    cinfo->output_scanline = 0;
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* QUANT_2PASS_SUPPORTED */
  }
  /* Ready for application to drive output pass through
   * jpeg_read_scanlines or jpeg_read_raw_data.
   */
  cinfo->global_state = cinfo->raw_data_out ? DSTATE_RAW_OK : DSTATE_SCANNING;
  return TRUE;
}